

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_set.h
# Opt level: O0

bool __thiscall
spvtools::EnumSet<spv::Capability>::contains(EnumSet<spv::Capability> *this,Capability value)

{
  Capability CVar1;
  ulong uVar2;
  Capability CVar3;
  size_t __n;
  size_type sVar4;
  const_reference pvVar5;
  BucketType BVar6;
  value_type *bucket;
  size_t index;
  Capability value_local;
  EnumSet<spv::Capability> *this_local;
  
  __n = FindBucketForValue(this,value);
  sVar4 = std::
          vector<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
          ::size(&this->buckets_);
  if (__n < sVar4) {
    pvVar5 = std::
             vector<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
             ::operator[](&this->buckets_,__n);
    CVar1 = pvVar5->start;
    CVar3 = ComputeBucketStart(value);
    if (CVar1 == CVar3) {
      pvVar5 = std::
               vector<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
               ::operator[](&this->buckets_,__n);
      uVar2 = pvVar5->data;
      BVar6 = ComputeMaskForValue(value);
      return (uVar2 & BVar6) != 0;
    }
  }
  return false;
}

Assistant:

bool contains(T value) const {
    const size_t index = FindBucketForValue(value);
    if (index >= buckets_.size() ||
        buckets_[index].start != ComputeBucketStart(value)) {
      return false;
    }
    auto& bucket = buckets_[index];
    return bucket.data & ComputeMaskForValue(value);
  }